

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

ReaderFor<DynamicCapability> *
capnp::DynamicValue::Reader::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (ReaderFor<DynamicCapability> *__return_storage_ptr__,Reader *reader)

{
  DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Fault f;
  
  _kjCondition.result = reader->type == CAPABILITY;
  _kjCondition.right = CAPABILITY;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &reader->type;
  if (_kjCondition.result) {
    (*(code *)((reader->field_1).structValue.reader.segment)->arena[4]._vptr_Arena)
              (__return_storage_ptr__);
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(reader->field_1).listValue.reader.segment;
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type_const&,capnp::DynamicValue::Type>&,char_const(&)[21]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x732,FAILED,"reader.type == CAPABILITY","_kjCondition,\"Value type mismatch.\"",
               &_kjCondition,(char (*) [21])"Value type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x1b7c60;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

ReaderFor<DynamicCapability> DynamicValue::Reader::AsImpl<DynamicCapability>::apply(
    const Reader& reader) {
  KJ_REQUIRE(reader.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return reader.capabilityValue;
}